

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::handleTabletEvent(QWidgetWindow *this,QTabletEvent *event)

{
  undefined4 uVar1;
  undefined2 uVar2;
  Data *pDVar3;
  QWidget *pQVar4;
  Data *pDVar5;
  QPoint QVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 *puVar9;
  long in_FS_OFFSET;
  byte bVar10;
  QTabletEvent *pQVar11;
  undefined1 extraout_XMM1_Be;
  undefined8 extraout_XMM1_Qb;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar19;
  undefined8 uVar18;
  undefined8 uVar20;
  undefined4 uVar22;
  undefined8 uVar21;
  undefined1 local_b8 [16];
  QTabletEvent ev;
  undefined1 uStack_9c;
  qreal local_a0;
  double local_48;
  double dStack_40;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (handleTabletEvent(QTabletEvent*)::qt_tablet_target == '\0') {
    handleTabletEvent();
  }
  if ((handleTabletEvent::qt_tablet_target.wp.d == (Data *)0x0) ||
     (pQVar4 = (QWidget *)handleTabletEvent::qt_tablet_target.wp.value,
     handleTabletEvent::qt_tablet_target.wp.value == (QObject *)0x0 ||
     *(int *)(handleTabletEvent::qt_tablet_target.wp.d + 4) == 0)) {
    pDVar5 = (this->m_widget).wp.d;
    if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
      pQVar4 = (QWidget *)0x0;
    }
    else {
      pQVar4 = (QWidget *)(this->m_widget).wp.value;
    }
    _ev = (QPoint)QEventPoint::position();
    pQVar4 = QWidget::childAt(pQVar4,(QPointF *)&ev);
    if (pQVar4 == (QWidget *)0x0) {
      pDVar5 = (this->m_widget).wp.d;
      if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
        pQVar4 = (QWidget *)0x0;
      }
      else {
        pQVar4 = (QWidget *)(this->m_widget).wp.value;
      }
    }
    if (*(short *)(event + 8) == 0x5c) {
      if (pQVar4 == (QWidget *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      else {
        pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar4->super_QObject);
      }
      pDVar3 = handleTabletEvent::qt_tablet_target.wp.d;
      handleTabletEvent::qt_tablet_target.wp.value = &pQVar4->super_QObject;
      handleTabletEvent::qt_tablet_target.wp.d = pDVar5;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar3 = *(int *)pDVar3 + -1;
        UNLOCK();
        if (*(int *)pDVar3 == 0) {
          operator_delete(pDVar3);
        }
      }
    }
    uStack_9c = extraout_XMM1_Be;
    if (pQVar4 == (QWidget *)0x0) goto LAB_00324043;
  }
  auVar15 = QEventPoint::globalPosition();
  auVar16 = QEventPoint::globalPosition();
  local_48 = -NAN;
  dStack_40 = -NAN;
  uVar20 = extraout_XMM1_Qb;
  auVar17 = QEventPoint::globalPosition();
  dVar12 = (double)((ulong)auVar17._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar17._0_8_;
  dVar13 = dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  _ev = (int)(double)(-(ulong)(2147483647.0 < dVar12) & 0x41dfffffffc00000 |
                     ~-(ulong)(2147483647.0 < dVar12) & (ulong)dVar13);
  dVar12 = (double)((ulong)auVar17._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar17._8_8_;
  dVar13 = dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  register0x00000004 =
       (int)(double)(-(ulong)(2147483647.0 < dVar12) & 0x41dfffffffc00000 |
                    ~-(ulong)(2147483647.0 < dVar12) & (ulong)dVar13);
  QVar6 = QWidget::mapFromGlobal(pQVar4,(QPoint *)&ev);
  auVar17._0_8_ =
       (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._0_8_;
  auVar17._8_8_ =
       (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar16._8_8_;
  auVar14 = maxpd(auVar17,_DAT_006605e0);
  local_48 = (double)QVar6.xp.m_i.m_i +
             (auVar15._0_8_ -
             (double)(int)(double)(~-(ulong)(2147483647.0 < auVar17._0_8_) & auVar14._0_8_ |
                                  -(ulong)(2147483647.0 < auVar17._0_8_) & 0x41dfffffffc00000));
  dStack_40 = (double)QVar6.yp.m_i.m_i +
              (auVar15._8_8_ -
              (double)(int)(double)(~-(ulong)(2147483647.0 < auVar17._8_8_) & auVar14._8_8_ |
                                   -(ulong)(2147483647.0 < auVar17._8_8_) & 0x41dfffffffc00000));
  puVar9 = &DAT_00666708;
  pQVar11 = &ev;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pQVar11 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
    pQVar11 = pQVar11 + (ulong)bVar10 * -0x10 + 8;
  }
  uVar2 = *(undefined2 *)(event + 8);
  uVar7 = QPointerEvent::pointingDevice();
  uVar19 = auVar16._12_4_;
  uVar22 = auVar16._4_4_;
  local_b8 = QEventPoint::globalPosition();
  pQVar11 = (QTabletEvent *)QEventPoint::pressure();
  uVar1 = *(undefined4 *)(event + 0x54);
  uVar21 = CONCAT44(uVar22,*(undefined4 *)(event + 0x58));
  uVar18 = CONCAT44(uVar19,*(undefined4 *)(event + 0x50));
  QEventPoint::rotation();
  QTabletEvent::QTabletEvent
            (pQVar11,uVar1,&ev,uVar2,uVar7,&local_48,local_b8,*(undefined4 *)(event + 0x20),
             *(undefined4 *)(event + 0x40),*(undefined4 *)(event + 0x44),uVar18,uVar20,uVar21);
  QPointerEvent::setTimestamp((ulonglong)&ev);
  QPointerEvent::setAccepted(SUB81(&ev,0));
  QCoreApplication::forwardEvent(&pQVar4->super_QObject,(QEvent *)&ev,(QEvent *)event);
  (**(code **)(*(long *)event + 0x10))(event,uStack_9c);
  QTabletEvent::~QTabletEvent(&ev);
LAB_00324043:
  if ((*(short *)(event + 8) == 0x5d) && (*(int *)(event + 0x44) == 0)) {
    pDVar5 = handleTabletEvent::qt_tablet_target.wp.d;
    handleTabletEvent::qt_tablet_target.wp.d = (Data *)0x0;
    handleTabletEvent::qt_tablet_target.wp.value = (QObject *)0x0;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar5 = *(int *)pDVar5 + -1;
      UNLOCK();
      if (*(int *)pDVar5 == 0) {
        operator_delete(pDVar5);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleTabletEvent(QTabletEvent *event)
{
    static QPointer<QWidget> qt_tablet_target = nullptr;

    QWidget *widget = qt_tablet_target;

    if (!widget) {
        widget = m_widget->childAt(event->position());
        if (!widget)
            widget = m_widget;
        if (event->type() == QEvent::TabletPress)
            qt_tablet_target = widget;
    }

    if (widget) {
        QPointF delta = event->globalPosition() - event->globalPosition().toPoint();
        QPointF mapped = widget->mapFromGlobal(event->globalPosition().toPoint()) + delta;
        QTabletEvent ev(event->type(), event->pointingDevice(), mapped, event->globalPosition(),
                        event->pressure(), event->xTilt(), event->yTilt(), event->tangentialPressure(),
                        event->rotation(), event->z(), event->modifiers(), event->button(), event->buttons());
        ev.setTimestamp(event->timestamp());
        ev.setAccepted(false);
        QGuiApplication::forwardEvent(widget, &ev, event);
        event->setAccepted(ev.isAccepted());
    }

    if (event->type() == QEvent::TabletRelease && event->buttons() == Qt::NoButton)
        qt_tablet_target = nullptr;
}